

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_common.c
# Opt level: O3

LY_ERR lysp_stmt_qnames(lysp_ctx *ctx,lysp_stmt *stmt,lysp_qname **qnames,yang_arg arg,
                       lysp_ext_instance **exts)

{
  lysp_qname *plVar1;
  LY_ERR LVar2;
  long *plVar3;
  long lVar4;
  char *pcVar5;
  char *pcVar6;
  undefined4 in_register_0000000c;
  char **str_p;
  uint64_t insubstmt_index;
  lysp_stmt *stmt_00;
  ly_ctx *plVar7;
  
  LVar2 = lysp_stmt_validate_value(ctx,Y_STR_ARG,stmt->arg);
  if (LVar2 != LY_SUCCESS) {
    return LVar2;
  }
  plVar1 = *qnames;
  if (plVar1 == (lysp_qname *)0x0) {
    plVar3 = (long *)malloc(0x20);
    if (plVar3 == (long *)0x0) goto LAB_0016b787;
    *plVar3 = 1;
    lVar4 = 1;
  }
  else {
    lVar4 = *(long *)&plVar1[-1].flags;
    *(long *)&plVar1[-1].flags = lVar4 + 1;
    plVar3 = (long *)realloc(&plVar1[-1].flags,lVar4 * 0x18 + 0x20);
    if (plVar3 == (long *)0x0) {
      *(long *)&(*qnames)[-1].flags = *(long *)&(*qnames)[-1].flags + -1;
LAB_0016b787:
      if (ctx == (lysp_ctx *)0x0) {
        plVar7 = (ly_ctx *)0x0;
      }
      else {
        plVar7 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      ly_log(plVar7,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysp_stmt_qnames");
      return LY_EMEM;
    }
    lVar4 = *plVar3;
  }
  *qnames = (lysp_qname *)(plVar3 + 1);
  str_p = (char **)(plVar3 + lVar4 * 3 + -2);
  *str_p = (char *)0x0;
  str_p[1] = (char *)0x0;
  str_p[2] = (char *)0x0;
  if (ctx == (lysp_ctx *)0x0) {
    plVar7 = (ly_ctx *)0x0;
  }
  else {
    plVar7 = (ly_ctx *)
             **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
  }
  LVar2 = lydict_insert(plVar7,stmt->arg,0,str_p);
  if (LVar2 == LY_SUCCESS) {
    plVar3[lVar4 * 3 + -1] = (long)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    for (stmt_00 = stmt->child; LVar2 = LY_SUCCESS, stmt_00 != (lysp_stmt *)0x0;
        stmt_00 = stmt_00->next) {
      if (stmt_00->kw != LY_STMT_EXTENSION_INSTANCE) {
        if (ctx == (lysp_ctx *)0x0) {
          plVar7 = (ly_ctx *)0x0;
        }
        else {
          plVar7 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        }
        pcVar5 = lyplg_ext_stmt2str(stmt_00->kw);
        pcVar6 = lyplg_ext_stmt2str(stmt->kw);
        ly_vlog(plVar7,(char *)0x0,LYVE_SYNTAX_YANG,"Invalid keyword \"%s\" as a child of \"%s\".",
                pcVar5,pcVar6);
        return LY_EVALID;
      }
      if (*qnames == (lysp_qname *)0x0) {
        insubstmt_index = 0xffffffffffffffff;
      }
      else {
        insubstmt_index = *(long *)&(*qnames)[-1].flags - 1;
      }
      LVar2 = lysp_stmt_ext(ctx,stmt_00,stmt->kw,insubstmt_index,
                            (lysp_ext_instance **)CONCAT44(in_register_0000000c,arg));
      if (LVar2 != LY_SUCCESS) {
        return LVar2;
      }
    }
  }
  return LVar2;
}

Assistant:

static LY_ERR
lysp_stmt_qnames(struct lysp_ctx *ctx, const struct lysp_stmt *stmt, struct lysp_qname **qnames, enum yang_arg arg,
        struct lysp_ext_instance **exts)
{
    struct lysp_qname *item;

    LY_CHECK_RET(lysp_stmt_validate_value(ctx, arg, stmt->arg));

    /* allocate new pointer */
    LY_ARRAY_NEW_RET(PARSER_CTX(ctx), *qnames, item, LY_EMEM);
    LY_CHECK_RET(lydict_insert(PARSER_CTX(ctx), stmt->arg, 0, &item->str));
    item->mod = PARSER_CUR_PMOD(ctx);

    for (const struct lysp_stmt *child = stmt->child; child; child = child->next) {
        switch (child->kw) {
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(lysp_stmt_ext(ctx, child, stmt->kw, LY_ARRAY_COUNT(*qnames) - 1, exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(child->kw), lyplg_ext_stmt2str(stmt->kw));
            return LY_EVALID;
        }
    }
    return LY_SUCCESS;
}